

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  pointer pLVar1;
  cmGeneratorTarget *pcVar2;
  cmake *this_00;
  bool bVar3;
  TargetType TVar4;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *pvVar5;
  char *val;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  string *__rhs;
  ArtifactType artifact;
  PolicyID id;
  LinkType lt;
  LinkEntry *linkEntry;
  pointer item;
  ostringstream w;
  cmComputeLinkDepends cld;
  string local_468;
  undefined1 local_448 [32];
  _Alloc_hider local_428;
  undefined1 local_420 [112];
  ios_base local_3b0 [264];
  undefined1 local_2a8 [16];
  undefined1 local_298 [616];
  
  TVar4 = cmGeneratorTarget::GetType(this->Target);
  if ((((TVar4 == EXECUTABLE) ||
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == SHARED_LIBRARY)) ||
      (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == MODULE_LIBRARY)) ||
     (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == STATIC_LIBRARY)) {
    if ((this->LinkLanguage)._M_string_length != 0) {
      local_428._M_p = (pointer)&this->Config;
      cmComputeLinkDepends::cmComputeLinkDepends
                ((cmComputeLinkDepends *)local_2a8,this->Target,(string *)local_428._M_p);
      cmComputeLinkDepends::SetOldLinkDirMode
                ((cmComputeLinkDepends *)local_2a8,this->OldLinkDirMode);
      pvVar5 = cmComputeLinkDepends::Compute((cmComputeLinkDepends *)local_2a8);
      pLVar1 = (pvVar5->
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (item = (pvVar5->
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start; item != pLVar1; item = item + 1) {
        if (item->IsSharedDep == true) {
          AddSharedDepItem(this,&item->Item,item->Target);
        }
        else {
          AddItem(this,&item->Item,item->Target);
        }
      }
      pcVar2 = this->Target;
      local_420._0_8_ = local_420 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,"LINK_SEARCH_END_STATIC","");
      val = cmGeneratorTarget::GetProperty(pcVar2,(string *)local_420);
      if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
      bVar3 = cmSystemTools::IsOn(val);
      lt = LinkStatic;
      if (!bVar3) {
        lt = this->StartLinkType;
      }
      SetCurrentLinkType(this,lt);
      if ((this->OldLinkDirMode == true) &&
         ((_Rb_tree_node_base *)local_298._576_8_ != (_Rb_tree_node_base *)(local_298 + 0x230))) {
        p_Var6 = (_Rb_tree_node_base *)local_298._576_8_;
        do {
          pcVar2 = *(cmGeneratorTarget **)(p_Var6 + 1);
          artifact = RuntimeBinaryArtifact;
          if (this->UseImportLibrary == true) {
            TVar4 = cmGeneratorTarget::GetType(pcVar2);
            artifact = (ArtifactType)(TVar4 == SHARED_LIBRARY);
          }
          cmGeneratorTarget::GetFullPath
                    ((string *)local_420,pcVar2,(string *)local_428._M_p,artifact,true);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->OldLinkDirItems,(string *)local_420);
          if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
            operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)(local_298 + 0x230));
      }
      bVar3 = FinishLinkerSearchDirectories(this);
      if ((bVar3) &&
         (AddImplicitLinkInfo(this),
         (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_468,(cmPolicies *)0x3c,id);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_420,local_468._M_dataplus._M_p,
                            local_468._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "\nSome library files are in directories implicitly searched by the linker when invoked for "
                   ,0x5a);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(this->LinkLanguage)._M_dataplus._M_p,
                            (this->LinkLanguage)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\n ",3);
        cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  ((string *)local_448,&this->CMP0060WarnItems,"\n ");
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_448._0_8_,local_448._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                   ,0x81);
        if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
          operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        this_00 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_448);
        cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_468,(cmListFileBacktrace *)local_448);
        if ((cmMakefile *)local_448._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
        std::ios_base::~ios_base(local_3b0);
      }
      cmComputeLinkDepends::~cmComputeLinkDepends((cmComputeLinkDepends *)local_2a8);
      return bVar3;
    }
    __rhs = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                   "CMake can not determine linker language for target: ",__rhs);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    if ((cmGeneratorTarget *)local_2a8._0_8_ != (cmGeneratorTarget *)local_298) {
      operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
    }
  }
  return false;
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link.
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY)) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: " +
      this->Target->GetName());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();

  // Add the link line items.
  for (cmComputeLinkDepends::LinkEntry const& linkEntry : linkEntries) {
    if (linkEntry.IsSharedDep) {
      this->AddSharedDepItem(linkEntry.Item, linkEntry.Target);
    } else {
      this->AddItem(linkEntry.Item, linkEntry.Target);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  const char* lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (cmSystemTools::IsOn(lss)) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (cmGeneratorTarget const* tgt : wrongItems) {
      bool implib = (this->UseImportLibrary &&
                     (tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      this->OldLinkDirItems.push_back(
        tgt->GetFullPath(this->Config, artifact, true));
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  return true;
}